

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O0

void save_state(char *path)

{
  FILE *__s;
  char *in_RDI;
  FILE *fp;
  savestate_header_t header;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  size_t local_10;
  
  local_40 = 0x44;
  local_3f = 0x47;
  local_3e = 0x42;
  local_38 = 0x118;
  local_30 = 0x3ecd4;
  local_28 = 0x108;
  local_20 = 0x48060;
  local_18 = mem->backup_size;
  local_10 = 0x4098;
  __s = fopen(in_RDI,"wb");
  fwrite(&local_40,0x38,1,__s);
  fwrite(cpu,local_38,1,__s);
  fwrite(ppu,local_30,1,__s);
  fwrite(bus,local_28,1,__s);
  fwrite(mem,local_20,1,__s);
  fwrite(mem->backup,local_18,1,__s);
  fwrite(apu,local_10,1,__s);
  fclose(__s);
  return;
}

Assistant:

void save_state(const char* path) {
    savestate_header_t header;
    header.magic[0] = 'D';
    header.magic[1] = 'G';
    header.magic[2] = 'B';
    header.cpu_size = sizeof(arm7tdmi_t);
    header.ppu_size = sizeof(gba_ppu_t);
    header.bus_size = sizeof(gbabus_t);
    header.mem_size = sizeof(gbamem_t);
    header.backup_size = mem->backup_size;
    header.apu_size = sizeof(gba_apu_t);

    FILE* fp = fopen(path, "wb");

    fwrite(&header, sizeof(savestate_header_t), 1, fp);
    fwrite(cpu, header.cpu_size, 1, fp);
    fwrite(ppu, header.ppu_size, 1, fp);
    fwrite(bus, header.bus_size, 1, fp);
    fwrite(mem, header.mem_size, 1, fp);
    fwrite(mem->backup, header.backup_size, 1, fp);
    fwrite(apu, header.apu_size, 1, fp);
    fclose(fp);
}